

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idhash.c
# Opt level: O1

int nni_id_remove(nni_id_map *m,uint64_t id)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  nni_id_entry *pnVar4;
  ulong uVar5;
  bool bVar6;
  
  sVar2 = id_find(m,id);
  if (sVar2 == 0xffffffffffffffff) {
    iVar1 = 0xc;
  }
  else {
    uVar5 = (ulong)((uint)id & m->id_cap - 1);
    do {
      m->id_load = m->id_load - 1;
      pnVar4 = m->id_entries + uVar5;
      if (uVar5 == sVar2) {
        pnVar4->val = (void *)0x0;
        pnVar4->key = 0;
        sVar3 = uVar5;
      }
      else {
        if (pnVar4->skips == 0) {
          nni_panic("%s: %d: assert err: %s",
                    "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/idhash.c"
                    ,0x107,"entry->skips > 0");
        }
        pnVar4->skips = pnVar4->skips - 1;
        sVar3 = (size_t)(m->id_cap - 1 & (int)uVar5 * 5 + 1U);
      }
      bVar6 = uVar5 != sVar2;
      uVar5 = sVar3;
    } while (bVar6);
    m->id_count = m->id_count - 1;
    id_resize(m);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
nni_id_remove(nni_id_map *m, uint64_t id)
{
	size_t index;
	size_t probe;

	if ((index = id_find(m, id)) == (size_t) -1) {
		return (NNG_ENOENT);
	}

	// Now we have found the index where the object exists.  We are going
	// to restart the search, until the index matches, to decrement the
	// skips counter.
	probe = ID_INDEX(m, id);

	for (;;) {
		nni_id_entry *entry;

		// The load was increased once each hashing operation we used
		// to place the item.  Decrement it accordingly.
		m->id_load--;
		entry = &m->id_entries[probe];
		if (probe == index) {
			entry->val = NULL;
			entry->key = 0; // invalid key
			break;
		}
		NNI_ASSERT(entry->skips > 0);
		entry->skips--;
		probe = ID_NEXT(m, probe);
	}

	m->id_count--;

	// Shrink -- but it's ok if we can't.
	(void) id_resize(m);

	return (0);
}